

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.c
# Opt level: O0

avl_node * avl_find_greaterequal(avl_tree *tree,void *key)

{
  int local_54;
  avl_node *paStack_50;
  int diff;
  avl_node *next;
  avl_node *node;
  void *key_local;
  avl_tree *tree_local;
  avl_node *local_28;
  void *local_20;
  avl_node *local_18;
  void *local_10;
  
  if (tree->root == (avl_node *)0x0) {
    tree_local = (avl_tree *)0x0;
  }
  else {
    node = (avl_node *)key;
    key_local = tree;
    next = _avl_find_rec(tree->root,key,tree->comp,&local_54);
    while (0 < local_54) {
      local_10 = key_local;
      local_18 = next;
      if (*(avl_node **)((long)key_local + 8) == next) {
        return (avl_node *)0x0;
      }
      next = (avl_node *)(next->list).next;
      local_54 = (**(code **)((long)key_local + 0x20))(node,next->key);
    }
    paStack_50 = next;
    while (local_54 < 1) {
      next = paStack_50;
      local_20 = key_local;
      local_28 = paStack_50;
      if (*key_local == paStack_50) break;
      paStack_50 = (avl_node *)(paStack_50->list).prev;
      local_54 = (**(code **)((long)key_local + 0x20))(node,paStack_50->key);
    }
    tree_local = (avl_tree *)next;
  }
  return (avl_node *)tree_local;
}

Assistant:

struct avl_node *
avl_find_greaterequal(const struct avl_tree *tree, const void *key) {
  struct avl_node *node, *next;
  int diff;

  if (tree->root == NULL)
    return NULL;

  node = _avl_find_rec(tree->root, key, tree->comp, &diff);

  /* go right as long as key>node.key */
  while (diff > 0) {
    if (list_is_last(&tree->list_head, &node->list)) {
      return NULL;
    }

    node = (struct avl_node *)node->list.next;
    diff = (*tree->comp)(key, node->key);
  }

  /* go left as long as key<=next_node.key */
  next = node;
  while (diff <= 0) {
    node = next;
    if (list_is_first(&tree->list_head, &node->list)) {
      break;
    }

    next = (struct avl_node *)node->list.prev;
    diff = (*tree->comp)(key, next->key);
  }
  return node;
}